

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchGetRootValueNoFastPath
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,DynamicObject *object,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  undefined1 local_78 [8];
  PropertyValueInfo info;
  ScriptContext *scriptContext;
  PropertyId propertyId_local;
  DynamicObject *object_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  bVar2 = VarIs<Js::RootObjectBase,Js::DynamicObject>(object);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1ff3,"(VarIs<RootObjectBase>(object))",
                                "Root must be a global object!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  info._56_8_ = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_78);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_78,functionBody,inlineCache,inlineCacheIndex,true);
  pvVar4 = OP_GetRootProperty(object,propertyId,(PropertyValueInfo *)local_78,
                              (ScriptContext *)info._56_8_);
  return pvVar4;
}

Assistant:

Var JavascriptOperators::PatchGetRootValueNoFastPath(FunctionBody *const functionBody, InlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, DynamicObject* object, PropertyId propertyId)
    {
        AssertMsg(VarIs<RootObjectBase>(object), "Root must be a global object!");

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, true);
        return JavascriptOperators::OP_GetRootProperty(object, propertyId, &info, scriptContext);
    }